

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O3

void Cec2_ManDestroy(Cec2_Man_t *p)

{
  long lVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int level;
  Vec_Wrd_t *__ptr;
  Vec_Ptr_t *pVVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  timespec ts;
  timespec local_40;
  
  if (p->pPars->fVerbose != 0) {
    level = 3;
    iVar3 = clock_gettime(3,&local_40);
    if (iVar3 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    lVar5 = p->timeSatUnsat + p->timeSatSat + p->timeSatUndec;
    lVar1 = p->timeStart;
    dVar9 = 0.0;
    lVar4 = lVar8 - lVar1;
    dVar11 = (double)lVar4;
    if (lVar4 != 0) {
      dVar9 = (dVar11 * 100.0) / dVar11;
    }
    dVar12 = (double)lVar5;
    dVar14 = 0.0;
    if (lVar8 != lVar1) {
      dVar14 = (dVar12 * 100.0) / dVar11;
    }
    dVar10 = (double)(lVar4 - (p->timeSim + lVar5 + p->timeRefine + p->timeExtra));
    dVar13 = 0.0;
    if (lVar8 != lVar1) {
      dVar13 = (dVar10 * 100.0) / dVar11;
    }
    Abc_Print(level,"%s =","SAT solving");
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar12 / 1000000.0,dVar14);
    Abc_Print(level,"%s =","  sat      ");
    dVar12 = 0.0;
    if (lVar8 != lVar1) {
      dVar12 = ((double)p->timeSatSat * 100.0) / dVar11;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatSat / 1000000.0,dVar12);
    Abc_Print(level,"%s =","  unsat    ");
    dVar12 = 0.0;
    if (lVar8 != lVar1) {
      dVar12 = ((double)p->timeSatUnsat * 100.0) / dVar11;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatUnsat / 1000000.0,dVar12);
    Abc_Print(level,"%s =","  fail     ");
    dVar12 = 0.0;
    if (lVar8 != lVar1) {
      dVar12 = ((double)p->timeSatUndec * 100.0) / dVar11;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatUndec / 1000000.0,dVar12);
    Abc_Print(level,"%s =","Simulation ");
    dVar12 = 0.0;
    if (lVar8 != lVar1) {
      dVar12 = ((double)p->timeSim * 100.0) / dVar11;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSim / 1000000.0,dVar12);
    Abc_Print(level,"%s =","Refinement ");
    dVar12 = 0.0;
    if (lVar8 != lVar1) {
      dVar12 = ((double)p->timeRefine * 100.0) / dVar11;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeRefine / 1000000.0,dVar12);
    Abc_Print(level,"%s =","Rollback   ");
    dVar12 = 0.0;
    if (lVar8 != lVar1) {
      dVar12 = ((double)p->timeExtra * 100.0) / dVar11;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeExtra / 1000000.0,dVar12);
    Abc_Print(level,"%s =","Other      ");
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar10 / 1000000.0,dVar13);
    Abc_Print(level,"%s =","TOTAL      ");
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar11 / 1000000.0,dVar9);
    fflush(_stdout);
  }
  pGVar2 = p->pAig;
  __ptr = pGVar2->vSims;
  if (__ptr != (Vec_Wrd_t *)0x0) {
    if (__ptr->pArray != (word *)0x0) {
      free(__ptr->pArray);
      pGVar2->vSims->pArray = (word *)0x0;
      __ptr = pGVar2->vSims;
      if (__ptr == (Vec_Wrd_t *)0x0) goto LAB_006518f8;
    }
    free(__ptr);
    pGVar2->vSims = (Vec_Wrd_t *)0x0;
  }
LAB_006518f8:
  Gia_ManCleanMark01(p->pAig);
  satoko_destroy(p->pSat);
  Gia_ManStopP(&p->pNew);
  pVVar6 = p->vFrontier;
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    if (pVVar6->pArray != (void **)0x0) {
      free(pVVar6->pArray);
      p->vFrontier->pArray = (void **)0x0;
      pVVar6 = p->vFrontier;
      if (pVVar6 == (Vec_Ptr_t *)0x0) goto LAB_0065194f;
    }
    free(pVVar6);
    p->vFrontier = (Vec_Ptr_t *)0x0;
  }
LAB_0065194f:
  pVVar6 = p->vFanins;
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    if (pVVar6->pArray != (void **)0x0) {
      free(pVVar6->pArray);
      p->vFanins->pArray = (void **)0x0;
      pVVar6 = p->vFanins;
      if (pVVar6 == (Vec_Ptr_t *)0x0) goto LAB_0065198b;
    }
    free(pVVar6);
    p->vFanins = (Vec_Ptr_t *)0x0;
  }
LAB_0065198b:
  pVVar7 = p->vNodesNew;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      p->vNodesNew->pArray = (int *)0x0;
      pVVar7 = p->vNodesNew;
      if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_006519c7;
    }
    free(pVVar7);
    p->vNodesNew = (Vec_Int_t *)0x0;
  }
LAB_006519c7:
  pVVar7 = p->vSatVars;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      p->vSatVars->pArray = (int *)0x0;
      pVVar7 = p->vSatVars;
      if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_00651a03;
    }
    free(pVVar7);
    p->vSatVars = (Vec_Int_t *)0x0;
  }
LAB_00651a03:
  pVVar7 = p->vObjSatPairs;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      p->vObjSatPairs->pArray = (int *)0x0;
      pVVar7 = p->vObjSatPairs;
      if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_00651a3f;
    }
    free(pVVar7);
    p->vObjSatPairs = (Vec_Int_t *)0x0;
  }
LAB_00651a3f:
  pVVar7 = p->vCexTriples;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      p->vCexTriples->pArray = (int *)0x0;
      pVVar7 = p->vCexTriples;
      if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_00651a73;
    }
    free(pVVar7);
  }
LAB_00651a73:
  free(p);
  return;
}

Assistant:

void Cec2_ManDestroy( Cec2_Man_t * p )
{
    if ( p->pPars->fVerbose ) 
    {
        abctime timeTotal = Abc_Clock() - p->timeStart;
        abctime timeSat   = p->timeSatSat + p->timeSatUnsat + p->timeSatUndec;
        abctime timeOther = timeTotal - timeSat - p->timeSim - p->timeRefine - p->timeExtra;
//        Abc_Print( 1, "%d\n", p->Num );
        ABC_PRTP( "SAT solving", timeSat,          timeTotal );
        ABC_PRTP( "  sat      ", p->timeSatSat,    timeTotal );
        ABC_PRTP( "  unsat    ", p->timeSatUnsat,  timeTotal );
        ABC_PRTP( "  fail     ", p->timeSatUndec,  timeTotal );
        ABC_PRTP( "Simulation ", p->timeSim,       timeTotal );
        ABC_PRTP( "Refinement ", p->timeRefine,    timeTotal );
        ABC_PRTP( "Rollback   ", p->timeExtra,     timeTotal );
        ABC_PRTP( "Other      ", timeOther,        timeTotal );
        ABC_PRTP( "TOTAL      ", timeTotal,        timeTotal );
        fflush( stdout );
    }

    Vec_WrdFreeP( &p->pAig->vSims );
    //Vec_WrdFreeP( &p->pAig->vSimsPi );
    Gia_ManCleanMark01( p->pAig );
    satoko_destroy( p->pSat );
    Gia_ManStopP( &p->pNew );
    Vec_PtrFreeP( &p->vFrontier );
    Vec_PtrFreeP( &p->vFanins );
    Vec_IntFreeP( &p->vNodesNew );
    Vec_IntFreeP( &p->vSatVars );
    Vec_IntFreeP( &p->vObjSatPairs );
    Vec_IntFreeP( &p->vCexTriples );
    ABC_FREE( p );
}